

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNCnst.cpp
# Opt level: O1

void __thiscall NaPNConstGen::set_out_dim(NaPNConstGen *this,uint nDim)

{
  NaReal *pNVar1;
  undefined4 *puVar2;
  
  NaPetriNode::check_tunable(&this->super_NaPetriNode);
  if (nDim != 0) {
    this->nOutDim = nDim;
    if (this->fConstVal != (NaReal *)0x0) {
      operator_delete__(this->fConstVal);
    }
    pNVar1 = (NaReal *)operator_new__((ulong)this->nOutDim << 3);
    this->fConstVal = pNVar1;
    return;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 3;
  __cxa_throw(puVar2,&NaException::typeinfo,0);
}

Assistant:

void
NaPNConstGen::set_out_dim (unsigned nDim)
{
    check_tunable();

    if(0 == nDim)
        throw(na_bad_value);

    nOutDim = nDim;

    delete[] fConstVal;
    fConstVal = new NaReal[nOutDim];
}